

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::FreezeInternal
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *instance,bool isConvertedType)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  SimpleDictionaryPropertyDescriptor<int> *pSVar5;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  int index;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_30;
  
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                              ,0x88a,"(IsNotExtensibleSupported)",
                              "This method must not be called for SimpleDictionaryTypeHandler<TPropertyIndex, IsNotExtensibleSupported = false>"
                             );
  if (bVar3) {
    *puVar4 = 0;
    DynamicTypeHandler::ChangeFlags(&this->super_DynamicTypeHandler,0xc1,0xc0);
    this_00 = (this->propertyMap).ptr;
    if (0 < this_00->count - this_00->freeCount) {
      index = 0;
      do {
        pSVar5 = JsUtil::
                 BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetReferenceAt(this_00,index);
        if ((pSVar5->Attributes & 0x10) == 0) {
          pSVar5->Attributes = pSVar5->Attributes & 0xe9;
        }
        index = index + 1;
        this_00 = (this->propertyMap).ptr;
      } while (index < this_00->count - this_00->freeCount);
    }
    if (!isConvertedType) {
      DynamicObject::ChangeType(instance);
    }
    bVar3 = DynamicObject::HasObjectArray(instance);
    if (*(long **)&(instance->field_1).field_1 != (long *)0x0 && bVar3) {
      (**(code **)(**(long **)&(instance->field_1).field_1 + 0x1c0))();
    }
    DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false);
    if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
      DynamicTypeHandler::InvalidateStoreFieldCachesForAllProperties
                (&this->super_DynamicTypeHandler,
                 (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr);
      pJVar1 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
      Memory::Recycler::WBSetBit((char *)&local_30);
      local_30 = &pJVar1->typesWithOnlyWritablePropertyProtoChain;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_30);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(local_30);
    }
    return 1;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::FreezeInternal(DynamicObject* instance, bool isConvertedType)
    {
        AssertMsg(IsNotExtensibleSupported, "This method must not be called for SimpleDictionaryTypeHandler<TPropertyIndex, IsNotExtensibleSupported = false>");

        this->ChangeFlags(IsExtensibleFlag | IsSealedOnceFlag | IsFrozenOnceFlag,
            0 | IsSealedOnceFlag | IsFrozenOnceFlag);

        //Set [[Writable]] flag of each property to false except for setter\getters
        //Set [[Configurable]] flag of each property to false
        SimpleDictionaryPropertyDescriptor<TPropertyIndex> *descriptor = nullptr;
        for (TPropertyIndex index = 0; index < propertyMap->Count(); index++)
        {
            descriptor = propertyMap->GetReferenceAt(index);
            if (!(descriptor->Attributes & PropertyLetConstGlobal))
            {
                descriptor->Attributes &= ~(PropertyWritable | PropertyConfigurable);
            }
        }

        if (!isConvertedType)
        {
            // Change of [[Writable]] property requires cache invalidation, hence ChangeType
            instance->ChangeType();
        }

        ArrayObject * objectArray = instance->GetObjectArray();
        if (objectArray)
        {
            objectArray->Freeze();
        }

        this->ClearHasOnlyWritableDataProperties();
        if (GetFlags() & IsPrototypeFlag)
        {
            InvalidateStoreFieldCachesForAllProperties(instance->GetScriptContext());
            instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
        }

        return TRUE;
    }